

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
slang::SmallVector<int,_32UL>::SmallVector(SmallVector<int,_32UL> *this,size_type capacity)

{
  (this->super_SmallVectorBase<int>).data_ =
       (pointer)(this->super_SmallVectorBase<int>).firstElement;
  (this->super_SmallVectorBase<int>).len = 0;
  (this->super_SmallVectorBase<int>).cap = 0x20;
  SmallVectorBase<int>::reserve(&this->super_SmallVectorBase<int>,capacity);
  return;
}

Assistant:

explicit SmallVector(size_type capacity, UninitializedTag) : Base(N) {
        this->reserve(capacity);
    }